

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O0

bool tcu::compareThreshold(RGBA a,RGBA b,RGBA threshold)

{
  bool bVar1;
  RGBA local_1c;
  RGBA local_18;
  RGBA local_14;
  RGBA threshold_local;
  RGBA b_local;
  RGBA a_local;
  
  local_18.m_value = threshold.m_value;
  local_14.m_value = b.m_value;
  threshold_local = a;
  bVar1 = RGBA::operator==(&threshold_local,&local_14);
  if (bVar1) {
    b_local.m_value._3_1_ = true;
  }
  else {
    local_1c = computeAbsDiff(threshold_local,local_14);
    b_local.m_value._3_1_ = RGBA::isBelowThreshold(&local_1c,local_18);
  }
  return b_local.m_value._3_1_;
}

Assistant:

inline bool compareThreshold (RGBA a, RGBA b, RGBA threshold)
{
	if (a == b) return true;	// Quick-accept
	return computeAbsDiff(a, b).isBelowThreshold(threshold);
}